

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerReflection::compile_abi_cxx11_
          (string *__return_storage_ptr__,CompilerReflection *this)

{
  element_type *peVar1;
  shared_ptr<simple_json::Stream> local_28;
  CompilerReflection *local_18;
  CompilerReflection *this_local;
  
  local_18 = this;
  this_local = (CompilerReflection *)__return_storage_ptr__;
  ::std::make_shared<simple_json::Stream>();
  ::std::shared_ptr<simple_json::Stream>::operator=(&this->json_stream,&local_28);
  ::std::shared_ptr<simple_json::Stream>::~shared_ptr(&local_28);
  peVar1 = ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
  simple_json::Stream::set_current_locale_radix_character
            (peVar1,(this->super_CompilerGLSL).current_locale_radix_character);
  peVar1 = ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
  simple_json::Stream::begin_json_object(peVar1);
  CompilerGLSL::reorder_type_alias(&this->super_CompilerGLSL);
  emit_entry_points(this);
  emit_types(this);
  emit_resources(this);
  emit_specialization_constants(this);
  peVar1 = ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
  simple_json::Stream::end_json_object(peVar1);
  peVar1 = ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
  simple_json::Stream::str_abi_cxx11_(__return_storage_ptr__,peVar1);
  return __return_storage_ptr__;
}

Assistant:

string CompilerReflection::compile()
{
	json_stream = std::make_shared<simple_json::Stream>();
	json_stream->set_current_locale_radix_character(current_locale_radix_character);
	json_stream->begin_json_object();
	reorder_type_alias();
	emit_entry_points();
	emit_types();
	emit_resources();
	emit_specialization_constants();
	json_stream->end_json_object();
	return json_stream->str();
}